

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_creator.cpp
# Opt level: O1

Graph * createGridGraph(Graph *__return_storage_ptr__,int n,int cost_min,int cost_max)

{
  StoredVertexList *this;
  long lVar1;
  long *plVar2;
  long *plVar3;
  type *ptVar4;
  pointer psVar5;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  *paVar6;
  Graph *this_00;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  value_type vVar11;
  __normal_iterator<const_boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>
  _Var12;
  type extraout_RDX;
  type tVar13;
  type extraout_RDX_00;
  type extraout_RDX_01;
  type extraout_RDX_02;
  type extraout_RDX_03;
  type extraout_RDX_04;
  type extraout_RDX_05;
  type extraout_RDX_06;
  type extraout_RDX_07;
  type extraout_RDX_08;
  size_type __new_size;
  ulong uVar14;
  long lVar15;
  type tVar16;
  type __args;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  _Var17;
  type *ptVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  Graph G;
  Graph *g;
  EdgeIterator ei;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  pairlist;
  EdgeIterator ei_end;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_1e8;
  Graph *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  undefined1 uStack_198;
  undefined7 uStack_197;
  char cStack_190;
  long *local_188;
  value_type local_180;
  long *local_178;
  value_type local_170;
  long local_168;
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
  local_160;
  ulong local_d0;
  type local_c8;
  int local_c0;
  int local_bc;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_b8;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  _Stack_b0;
  long local_a8;
  long local_98;
  long local_90;
  undefined8 *local_88;
  undefined8 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined1 uStack_68;
  undefined8 uStack_67;
  long *local_58;
  
  __args._4_4_ = 0;
  __args._0_4_ = n;
  tVar16 = (type)&local_160;
  local_1b0 = __return_storage_ptr__;
  local_c0 = cost_min;
  local_bc = cost_max;
  boost::
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  ::adjacency_list(&local_1e8,(no_property *)tVar16);
  uStack_198 = 0;
  uStack_197 = 0;
  cStack_190 = '\0';
  local_1a8 = 0;
  local_1a0 = 0;
  uStack_19f = 0;
  uStack_68 = 0;
  uStack_67 = 0;
  local_78 = 0;
  local_70 = 0;
  uStack_6f = 0;
  uVar7 = n * n;
  tVar13 = extraout_RDX;
  if (1 < uVar7) {
    tVar16._0_4_ = n / 2;
    tVar16._4_4_ = 0;
    uVar21 = 2;
    if (2 < (int)uVar7) {
      uVar21 = uVar7;
    }
    local_d0 = (ulong)(int)(tVar16._0_4_ * n);
    local_90 = -(ulong)(((uVar7 >> 1) + tVar16._0_4_) - 1);
    local_98 = -(ulong)((uVar7 >> 1) + tVar16._0_4_);
    __new_size = 2;
    lVar15 = 0;
    local_c8 = tVar16;
    do {
      uVar14 = __new_size - 2;
      uVar19 = (long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff) % (long)n;
      tVar13 = (type)(uVar19 & 0xffffffff);
      iVar8 = (int)uVar19;
      if (iVar8 != n + -1) {
        if (iVar8 < (int)local_c8._0_4_ && (long)local_d0 <= (long)uVar14) {
          if ((local_90 + __new_size == 2) || (local_98 + __new_size == 2)) goto LAB_0010cec0;
          iVar8 = randomRange(0,1);
          uVar19 = __new_size - 1;
          if (iVar8 == 0) {
            if ((ulong)((long)local_1e8.super_type.m_vertices.
                              super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1e8.super_type.m_vertices.
                              super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar19) {
              std::
              vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
              ::resize(&local_1e8.super_type.m_vertices,__new_size);
            }
            psVar5 = local_1e8.super_type.m_vertices.
                     super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_160.first.vBegin.m_value = uVar14;
            local_160.first.vCurr.m_value = (value_type)operator_new(4);
            tVar16 = (type)&local_160;
            std::
            vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
            ::emplace_back<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>
                      ((vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
                        *)((long)&(((StoredVertex *)&((type *)((long)psVar5 + 0x20))->field_0x0)->
                                  m_out_edges).
                                  super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar15),
                       (stored_edge_property<unsigned_long,_EdgeProperties> *)tVar16);
            tVar13 = extraout_RDX_03;
          }
          else {
            if ((ulong)((long)local_1e8.super_type.m_vertices.
                              super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1e8.super_type.m_vertices.
                              super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar19) {
              std::
              vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
              ::resize(&local_1e8.super_type.m_vertices,__new_size);
            }
            psVar5 = local_1e8.super_type.m_vertices.
                     super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_160.first.vBegin.m_value = uVar19;
            local_160.first.vCurr.m_value = (value_type)operator_new(4);
            tVar16 = (type)&local_160;
            std::
            vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
            ::emplace_back<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>
                      ((vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
                        *)((long)&(psVar5->super_StoredVertex).m_out_edges.
                                  super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar15),
                       (stored_edge_property<unsigned_long,_EdgeProperties> *)tVar16);
            tVar13 = extraout_RDX_00;
          }
        }
        else {
          if ((ulong)((long)local_1e8.super_type.m_vertices.
                            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1e8.super_type.m_vertices.
                            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) <= __new_size - 1) {
            std::
            vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
            ::resize(&local_1e8.super_type.m_vertices,__new_size);
          }
          psVar5 = local_1e8.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_160.first.vBegin.m_value = __new_size - 1;
          local_160.first.vCurr.m_value = (value_type)operator_new(4);
          tVar16 = (type)&local_160;
          std::
          vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
          ::emplace_back<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>
                    ((vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
                      *)((long)&(psVar5->super_StoredVertex).m_out_edges.
                                super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar15),
                     (stored_edge_property<unsigned_long,_EdgeProperties> *)tVar16);
          tVar13 = extraout_RDX_01;
        }
        if ((void *)local_160.first.vCurr.m_value != (void *)0x0) {
          tVar16 = (type)0x4;
          operator_delete((void *)local_160.first.vCurr.m_value,4);
          tVar13 = extraout_RDX_02;
        }
      }
LAB_0010cec0:
      lVar15 = lVar15 + 0x20;
      lVar1 = __new_size - (uVar21 - 1);
      __new_size = __new_size + 1;
    } while (lVar1 != 1);
  }
  if (uVar7 - n != 0 && n <= (int)uVar7) {
    local_c8._0_4_ = n / 2;
    local_c8._4_4_ = 0;
    iVar8 = local_c8._0_4_ - 1;
    local_d0 = (ulong)(~local_c8._0_4_ + (uVar7 >> 1));
    uVar14 = 0;
    do {
      if ((long)uVar14 < (long)(iVar8 * n)) {
LAB_0010d022:
        uVar19 = uVar14 + (long)n;
        uVar20 = uVar19;
        if (uVar19 < uVar14) {
          uVar20 = uVar14;
        }
        if ((ulong)((long)local_1e8.super_type.m_vertices.
                          super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_1e8.super_type.m_vertices.
                          super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar20) {
          std::
          vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
          ::resize(&local_1e8.super_type.m_vertices,uVar20 + 1);
        }
        psVar5 = local_1e8.super_type.m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_160.first.vBegin.m_value = uVar19;
        local_160.first.vCurr.m_value = (value_type)operator_new(4);
        __args = (type)&local_160;
        std::
        vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
        ::emplace_back<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>
                  ((vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
                    *)((long)psVar5 + uVar14 * 4 * 8),
                   (stored_edge_property<unsigned_long,_EdgeProperties> *)__args);
        tVar13 = extraout_RDX_05;
LAB_0010d089:
        if ((void *)local_160.first.vCurr.m_value != (void *)0x0) {
          __args = (type)0x4;
          operator_delete((void *)local_160.first.vCurr.m_value,4);
          tVar13 = extraout_RDX_06;
        }
      }
      else {
        uVar19 = (long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff) % (long)n;
        tVar13 = (type)(uVar19 & 0xffffffff);
        if ((int)local_c8._0_4_ <= (int)uVar19) goto LAB_0010d022;
        if (uVar14 != local_d0) {
          iVar9 = randomRange(0,1);
          uVar19 = uVar14 + (long)n;
          if (iVar9 == 0) {
            uVar20 = uVar14;
            if (uVar14 < uVar19) {
              uVar20 = uVar19;
            }
            if ((ulong)((long)local_1e8.super_type.m_vertices.
                              super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1e8.super_type.m_vertices.
                              super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar20) {
              std::
              vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
              ::resize(&local_1e8.super_type.m_vertices,uVar20 + 1);
            }
            psVar5 = local_1e8.super_type.m_vertices.
                     super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_160.first.vBegin.m_value = uVar14;
            local_160.first.vCurr.m_value = (value_type)operator_new(4);
            __args = (type)&local_160;
            std::
            vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
            ::emplace_back<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>
                      ((vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
                        *)((long)psVar5 + uVar19 * 4 * 8),
                       (stored_edge_property<unsigned_long,_EdgeProperties> *)__args);
            tVar13 = extraout_RDX_07;
          }
          else {
            uVar20 = uVar19;
            if (uVar19 < uVar14) {
              uVar20 = uVar14;
            }
            if ((ulong)((long)local_1e8.super_type.m_vertices.
                              super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1e8.super_type.m_vertices.
                              super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar20) {
              std::
              vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
              ::resize(&local_1e8.super_type.m_vertices,uVar20 + 1);
            }
            psVar5 = local_1e8.super_type.m_vertices.
                     super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_160.first.vBegin.m_value = uVar19;
            local_160.first.vCurr.m_value = (value_type)operator_new(4);
            __args = (type)&local_160;
            std::
            vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
            ::emplace_back<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>
                      ((vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
                        *)((long)psVar5 + uVar14 * 4 * 8),
                       (stored_edge_property<unsigned_long,_EdgeProperties> *)__args);
            tVar13 = extraout_RDX_04;
          }
          goto LAB_0010d089;
        }
      }
      uVar14 = uVar14 + 1;
      tVar16 = __args;
    } while (uVar14 != uVar7 - n);
  }
  this_00 = local_1b0;
  local_160.first.vEnd.m_value =
       (long)local_1e8.super_type.m_vertices.
             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_1e8.super_type.m_vertices.
             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_b8._M_current = (pair<unsigned_long,_unsigned_long> *)0x0;
  _Stack_b0._M_current = (pair<unsigned_long,_unsigned_long> *)0x0;
  local_a8 = 0;
  if (local_1e8.super_type.m_vertices.
      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_1e8.super_type.m_vertices.
      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_160.first.vCurr.m_value = 0;
    local_160.first.edges.super_type.m_initialized = false;
  }
  else {
    tVar13 = *(type *)local_1e8.super_type.m_vertices.
                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    tVar16 = *(type *)((long)local_1e8.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data._M_start + 8);
    if (tVar16 == tVar13) {
      ptVar18 = (type *)((long)local_1e8.super_type.m_vertices.
                               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                               ._M_impl.super__Vector_impl_data._M_start + 0x28);
      local_160.first.vCurr.m_value = 0;
      do {
        if (local_160.first.vEnd.m_value - 1 == local_160.first.vCurr.m_value) {
          local_160.first.edges.super_type.m_initialized = false;
          local_160.first.vCurr.m_value = local_160.first.vEnd.m_value;
          goto LAB_0010d1a0;
        }
        tVar13 = (type)((_Vector_impl_data *)(ptVar18 + -1))->_M_start;
        tVar16 = *ptVar18;
        ptVar18 = ptVar18 + 4;
        local_160.first.vCurr.m_value = local_160.first.vCurr.m_value + 1;
      } while (tVar16 == tVar13);
    }
    else {
      local_160.first.vCurr.m_value = 0;
    }
    local_160.first.edges.super_type.m_initialized = true;
  }
LAB_0010d1a0:
  local_160.first.m_g = &local_1e8;
  local_160.first.vBegin.m_value = 0;
  if (local_160.first.edges.super_type.m_initialized) {
    local_160.first.edges.super_type.m_storage.dummy_.aligner_ = tVar13;
    local_160.first.edges.super_type.m_storage.dummy_._8_8_ = local_160.first.vCurr.m_value;
    local_160.first.edges.super_type.m_storage.dummy_._16_8_ = tVar16;
    local_160.first.edges.super_type.m_storage.dummy_._24_8_ = local_160.first.vCurr.m_value;
  }
  local_160.second.vBegin.m_value = 0;
  local_160.second.edges.super_type.m_initialized = false;
  local_160.second.vCurr.m_value = local_160.first.vEnd.m_value;
  local_160.second.vEnd.m_value = local_160.first.vEnd.m_value;
  local_160.second.m_g = local_160.first.m_g;
  local_88 = &local_1a8;
  local_80 = &local_78;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_88,&local_160);
  if (local_160.second.edges.super_type.m_initialized == true) {
    local_160.second.edges.super_type.m_initialized = false;
  }
  if (local_160.first.edges.super_type.m_initialized == true) {
    local_160.first.edges.super_type.m_initialized = false;
  }
LAB_0010d275:
  do {
    if (CONCAT71(uStack_19f,local_1a0) == CONCAT71(uStack_6f,local_70)) {
      if (CONCAT71(uStack_19f,local_1a0) != CONCAT71(uStack_197,uStack_198)) {
        if ((cStack_190 == '\0') || (uStack_67._7_1_ == '\0')) goto LAB_0010d81d;
        if (local_188 != local_58) goto LAB_0010d2bb;
      }
      _Var17._M_current = local_b8._M_current;
      boost::
      adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>
      ::
      adjacency_list<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>>
                ((adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>
                  *)this_00,local_b8,_Stack_b0,
                 (long)local_1e8.super_type.m_vertices.
                       super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1e8.super_type.m_vertices.
                       super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,0,(no_property *)&local_160);
      iVar9 = local_bc;
      iVar8 = local_c0;
      ptVar18 = (type *)(this_00->super_type).m_vertices.
                        super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      ptVar4 = (type *)(this_00->super_type).m_vertices.
                       super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
      local_160.first.vEnd.m_value = (long)ptVar4 - (long)ptVar18 >> 5;
      if (ptVar4 == ptVar18) {
        local_160.first.vCurr.m_value = 0;
        local_160.first.edges.super_type.m_initialized = false;
        tVar16 = extraout_RDX_08;
        goto LAB_0010d428;
      }
      tVar16 = *ptVar18;
      _Var17._M_current = *(pair<unsigned_long,_unsigned_long> **)(ptVar18 + 1);
      if ((type)_Var17._M_current != tVar16) {
        local_160.first.vCurr.m_value = 0;
        goto LAB_0010d414;
      }
      ptVar18 = ptVar18 + 5;
      local_160.first.vCurr.m_value = 0;
      break;
    }
LAB_0010d2bb:
    if (cStack_190 == '\0') goto LAB_0010d81d;
    local_160.first.vBegin.m_value = local_180;
    local_88 = (undefined8 *)*local_188;
    std::
    vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::emplace_back<unsigned_long,unsigned_long>
              ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&local_b8,(unsigned_long *)&local_160,(unsigned_long *)&local_88);
    if (cStack_190 == '\0') {
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c6,
                    "pointer_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                   );
    }
    local_188 = local_188 + 2;
    if (local_188 == local_178) {
      vVar11 = CONCAT71(uStack_19f,local_1a0);
      lVar15 = vVar11 * 0x20 + 0x28;
      do {
        if (CONCAT71(uStack_197,uStack_198) - 1U == vVar11) {
          local_1a0 = uStack_198;
          uStack_19f = uStack_197;
          goto LAB_0010d275;
        }
        plVar2 = *(long **)(*(long *)(local_168 + 0x18) + -8 + lVar15);
        plVar3 = *(long **)(*(long *)(local_168 + 0x18) + lVar15);
        lVar15 = lVar15 + 0x20;
        vVar11 = vVar11 + 1;
      } while (plVar3 == plVar2);
      local_1a0 = (undefined1)vVar11;
      uStack_19f = (undefined7)(vVar11 >> 8);
      local_188 = plVar2;
      local_180 = vVar11;
      local_178 = plVar3;
      local_170 = vVar11;
    }
  } while( true );
  while( true ) {
    tVar16 = (type)((_Vector_impl_data *)(ptVar18 + -1))->_M_start;
    _Var17._M_current = *(pair<unsigned_long,_unsigned_long> **)ptVar18;
    ptVar18 = ptVar18 + 4;
    local_160.first.vCurr.m_value = local_160.first.vCurr.m_value + 1;
    if ((type)_Var17._M_current != tVar16) break;
    if (local_160.first.vEnd.m_value - 1 == local_160.first.vCurr.m_value) {
      local_160.first.edges.super_type.m_initialized = false;
      local_160.first.vCurr.m_value = local_160.first.vEnd.m_value;
      goto LAB_0010d428;
    }
  }
LAB_0010d414:
  local_160.first.edges.super_type.m_initialized = true;
LAB_0010d428:
  local_160.first.vBegin.m_value = 0;
  if (local_160.first.edges.super_type.m_initialized) {
    local_160.first.edges.super_type.m_storage.dummy_.aligner_ = tVar16;
    local_160.first.edges.super_type.m_storage.dummy_._8_8_ = local_160.first.vCurr.m_value;
    local_160.first.edges.super_type.m_storage.dummy_._16_8_ = _Var17._M_current;
    local_160.first.edges.super_type.m_storage.dummy_._24_8_ = local_160.first.vCurr.m_value;
  }
  local_160.first.m_g = this_00;
  local_160.second.vBegin.m_value = 0;
  local_160.second.edges.super_type.m_initialized = false;
  local_160.second.m_g = this_00;
  local_160.second.vCurr.m_value = local_160.first.vEnd.m_value;
  local_160.second.vEnd.m_value = local_160.first.vEnd.m_value;
  local_88 = &local_1a8;
  local_80 = &local_78;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_88,&local_160);
  if (local_160.second.edges.super_type.m_initialized == true) {
    local_160.second.edges.super_type.m_initialized = false;
  }
  if (local_160.first.edges.super_type.m_initialized == true) {
    local_160.first.edges.super_type.m_initialized = false;
  }
  this = &(this_00->super_type).m_vertices;
LAB_0010d4dc:
  do {
    if (CONCAT71(uStack_19f,local_1a0) == CONCAT71(uStack_6f,local_70)) {
      if (CONCAT71(uStack_19f,local_1a0) == CONCAT71(uStack_197,uStack_198)) {
LAB_0010d5c2:
        uVar7 = uVar7 >> 1;
        uVar21 = n / 2;
        uVar19 = (ulong)(int)(uVar7 + uVar21);
        uVar20 = (ulong)(int)(uVar7 + uVar21 + -1);
        uVar14 = uVar20;
        if (uVar20 < uVar19) {
          uVar14 = uVar19;
        }
        if ((ulong)((long)(this_00->super_type).m_vertices.
                          super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this_00->super_type).m_vertices.
                          super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14) {
          std::
          vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
          ::resize(this,uVar14 + 1);
        }
        psVar5 = (this->
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_160.first.vBegin.m_value = uVar20;
        local_160.first.vCurr.m_value = (value_type)operator_new(4);
        std::
        vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
        ::emplace_back<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>
                  ((vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
                    *)(psVar5 + uVar19),
                   (stored_edge_property<unsigned_long,_EdgeProperties> *)&local_160);
        if ((void *)local_160.first.vCurr.m_value != (void *)0x0) {
          operator_delete((void *)local_160.first.vCurr.m_value,4);
        }
        psVar5 = (this->
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_160.first.vBegin.m_value = uVar20;
        local_160.first.vCurr.m_value = (value_type)operator_new(4);
        *(undefined4 *)local_160.first.vCurr.m_value = 0;
        _Var12 = std::
                 __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>const*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>const>>
                           (*(undefined8 *)
                             &psVar5[uVar19].super_StoredVertex.m_out_edges.
                              super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                            ,*(pointer *)
                              ((long)&psVar5[uVar19].super_StoredVertex.m_out_edges.
                                      super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                              + 8));
        if ((undefined4 *)local_160.first.vCurr.m_value != (undefined4 *)0x0) {
          operator_delete((void *)local_160.first.vCurr.m_value,4);
        }
        (((_Var12._M_current)->m_property)._M_t.
         super___uniq_ptr_impl<EdgeProperties,_std::default_delete<EdgeProperties>_>._M_t.
         super__Tuple_impl<0UL,_EdgeProperties_*,_std::default_delete<EdgeProperties>_>.
         super__Head_base<0UL,_EdgeProperties_*,_false>._M_head_impl)->weight = -10000;
        uVar19 = (ulong)(int)(uVar7 + ~uVar21);
        uVar14 = uVar19;
        if (uVar19 < uVar20) {
          uVar14 = uVar20;
        }
        if ((ulong)((long)(this_00->super_type).m_vertices.
                          super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this_00->super_type).m_vertices.
                          super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14) {
          std::
          vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
          ::resize(this,uVar14 + 1);
        }
        psVar5 = (this->
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_160.first.vBegin.m_value = uVar19;
        local_160.first.vCurr.m_value = (value_type)operator_new(4);
        std::
        vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
        ::emplace_back<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>
                  ((vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
                    *)(psVar5 + uVar20),
                   (stored_edge_property<unsigned_long,_EdgeProperties> *)&local_160);
        if ((void *)local_160.first.vCurr.m_value != (void *)0x0) {
          operator_delete((void *)local_160.first.vCurr.m_value,4);
        }
        psVar5 = (this->
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_160.first.vBegin.m_value = uVar19;
        local_160.first.vCurr.m_value = (value_type)operator_new(4);
        *(undefined4 *)local_160.first.vCurr.m_value = 0;
        _Var12 = std::
                 __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>const*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>const>>
                           (*(undefined8 *)
                             &psVar5[uVar20].super_StoredVertex.m_out_edges.
                              super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                            ,*(pointer *)
                              ((long)&psVar5[uVar20].super_StoredVertex.m_out_edges.
                                      super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                              + 8));
        if ((undefined4 *)local_160.first.vCurr.m_value != (undefined4 *)0x0) {
          operator_delete((void *)local_160.first.vCurr.m_value,4);
        }
        (((_Var12._M_current)->m_property)._M_t.
         super___uniq_ptr_impl<EdgeProperties,_std::default_delete<EdgeProperties>_>._M_t.
         super__Tuple_impl<0UL,_EdgeProperties_*,_std::default_delete<EdgeProperties>_>.
         super__Head_base<0UL,_EdgeProperties_*,_false>._M_head_impl)->weight = -10000;
        if (local_b8._M_current != (pair<unsigned_long,_unsigned_long> *)0x0) {
          operator_delete(local_b8._M_current,local_a8 - (long)local_b8._M_current);
        }
        if (uStack_67._7_1_ == '\x01') {
          uStack_67 = uStack_67 & 0xffffffffffffff;
        }
        if (cStack_190 == '\x01') {
          cStack_190 = '\0';
        }
        if (local_1e8.m_property.px != (no_property *)0x0) {
          operator_delete(local_1e8.m_property.px,1);
        }
        std::
        vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
        ::~vector(&local_1e8.super_type.m_vertices);
        while ((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                *)local_1e8.super_type.m_edges.
                  super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next != &local_1e8) {
          paVar6 = (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                    *)(((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                         *)local_1e8.super_type.m_edges.
                           super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                           ._M_impl._M_node.super__List_node_base._M_next)->super_type).m_edges.
                      super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next;
          operator_delete(local_1e8.super_type.m_edges.
                          super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next,0x28);
          local_1e8.super_type.m_edges.
          super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
          ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)paVar6;
        }
        return this_00;
      }
      if ((cStack_190 == '\0') || (uStack_67._7_1_ == '\0')) {
LAB_0010d81d:
        __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c5,
                      "pointer_const_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() const [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                     );
      }
      if (local_188 == local_58) goto LAB_0010d5c2;
    }
    iVar10 = randomRange(iVar8,iVar9);
    if (cStack_190 == '\0') goto LAB_0010d81d;
    *(int *)local_188[1] = iVar10;
    local_188 = local_188 + 2;
    if (local_188 == local_178) {
      vVar11 = CONCAT71(uStack_19f,local_1a0);
      lVar15 = vVar11 * 0x20 + 0x28;
      do {
        if (CONCAT71(uStack_197,uStack_198) - 1U == vVar11) {
          local_1a0 = uStack_198;
          uStack_19f = uStack_197;
          goto LAB_0010d4dc;
        }
        plVar2 = *(long **)(*(long *)(local_168 + 0x18) + -8 + lVar15);
        plVar3 = *(long **)(*(long *)(local_168 + 0x18) + lVar15);
        lVar15 = lVar15 + 0x20;
        vVar11 = vVar11 + 1;
      } while (plVar3 == plVar2);
      local_1a0 = (undefined1)vVar11;
      uStack_19f = (undefined7)(vVar11 >> 8);
      local_188 = plVar2;
      local_180 = vVar11;
      local_178 = plVar3;
      local_170 = vVar11;
    }
  } while( true );
}

Assistant:

Graph createGridGraph(int n, int cost_min, int cost_max)
{
    Graph G;
    EdgeIterator ei, ei_end;

    for (int i = 0; i < n*n-1; ++i) {
        if( i%n == n-1) continue;
            
        if (i >= n*(n/2) && i%n < n/2 )
        {
            if (i == n*n/2 + n/2 -1 || i == n*n/2 + n/2) {
                continue;
            } else if(randomRange(0,1)){
                add_edge(i, i+1, G);
            } else {
                add_edge(i+1, i, G);    
            }
            continue;
        }
        add_edge(i, i+1, G);
    }

    for (int i = 0; i < n*n-n; ++i) {
        if (i >= n*(n/2-1) && i%n < n/2 ) {
            if (i == n*n/2 - n/2 - 1) {
                continue;
            } else if(randomRange(0,1)) {
                add_edge(i, i+n, G);
            } else {
                add_edge(i+n, i, G);    
            }
            continue;
        }
        add_edge(i, i+n, G);
    }

    // Converting to EdgeList graph
    std::vector<std::pair<Graph::vertex_descriptor, Graph::vertex_descriptor> > pairlist;
    for (boost::tie(ei, ei_end) = boost::edges(G); ei!=ei_end; ++ei) {
        pairlist.emplace_back(source(*ei, G), target(*ei, G));
    }
    Graph g(pairlist.begin(), pairlist.end(), num_vertices(G));

    // Adding weights
    for(boost::tie(ei, ei_end) = boost::edges(g); ei != ei_end; ++ei) {
        g[*ei].weight = randomRange(cost_min, cost_max);
    }

    add_edge(n*n/2 + n/2, n*n/2 + n/2 - 1, g);
    g[edge(n*n/2 + n/2, n*n/2 + n/2 - 1, g).first].weight = -10000;
    add_edge(n*n/2 + n/2 - 1, n*n/2 - n/2 - 1, g);
    g[edge(n*n/2 + n/2 - 1, n*n/2 - n/2 - 1, g).first].weight = -10000;

    return g;
}